

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O3

bool __thiscall
QRhiGles2::compileShader
          (QRhiGles2 *this,GLuint program,QRhiShaderStage *shaderStage,QShaderVersion *shaderVersion
          )

{
  QHash<QRhiShaderStage,_unsigned_int> *this_00;
  Span *pSVar1;
  QOpenGLExtensions *pQVar2;
  uint uVar3;
  qsizetype qVar4;
  uint uVar5;
  Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *d;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  char *pcVar10;
  long in_FS_OFFSET;
  const_iterator cVar11;
  iterator iVar12;
  GLsizei length;
  GLint infoLogLength;
  GLint compiled;
  GLint srcLength;
  char *srcStr;
  char local_b8 [24];
  char *local_a0;
  QByteArray local_98;
  uint local_74;
  int local_70;
  undefined4 local_6c;
  char *local_68;
  uint local_5c;
  QByteArray local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  shaderSource(&local_58,this,shaderStage,shaderVersion);
  qVar4 = local_58.d.size;
  if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) {
LAB_0056eb20:
    bVar9 = false;
    goto LAB_0056eb22;
  }
  this_00 = &this->m_shaderCache;
  cVar11 = QHash<QRhiShaderStage,_unsigned_int>::constFindImpl<QRhiShaderStage>(this_00,shaderStage)
  ;
  if (cVar11.i.d == (Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *)0x0 &&
      cVar11.i.bucket == 0) {
    uVar5 = (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
              functions[0x40])((ulong)*(uint *)(&DAT_006b68b4 + (long)(int)shaderStage->m_type * 4))
    ;
    pcVar10 = local_58.d.ptr;
    if (local_58.d.ptr == (char *)0x0) {
      pcVar10 = (char *)&QByteArray::_empty;
    }
    local_6c = (undefined4)qVar4;
    local_68 = pcVar10;
    local_5c = uVar5;
    (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions
      [0x6c])((ulong)uVar5,1);
    (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions
      [0x3c])((ulong)uVar5);
    local_70 = 0;
    (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions
      [0x58])((ulong)uVar5,0x8b81,&local_70);
    if (local_70 == 0) {
      local_74 = 0;
      (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions
        [0x58])((ulong)uVar5,0x8b84,&local_74);
      local_98.d.d = (Data *)0x0;
      local_98.d.ptr = (char *)0x0;
      local_98.d.size = 0;
      if (1 < (int)local_74) {
        local_b8[0] = '\0';
        local_b8[1] = '\0';
        local_b8[2] = '\0';
        local_b8[3] = '\0';
        QByteArray::resize((longlong)&local_98);
        uVar3 = local_74;
        pQVar2 = this->f;
        pcVar6 = QByteArray::data(&local_98);
        (*(((pQVar2->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions
          [0x59])((ulong)uVar5,(ulong)uVar3,local_b8,pcVar6);
      }
      local_b8[0] = '\x02';
      local_b8[1] = '\0';
      local_b8[2] = '\0';
      local_b8[3] = '\0';
      local_b8[4] = '\0';
      local_b8[5] = '\0';
      local_b8[6] = '\0';
      local_b8[7] = '\0';
      local_b8[8] = '\0';
      local_b8[9] = '\0';
      local_b8[10] = '\0';
      local_b8[0xb] = '\0';
      local_b8[0xc] = '\0';
      local_b8[0xd] = '\0';
      local_b8[0xe] = '\0';
      local_b8[0xf] = '\0';
      local_b8[0x10] = '\0';
      local_b8[0x11] = '\0';
      local_b8[0x12] = '\0';
      local_b8[0x13] = '\0';
      local_b8[0x14] = '\0';
      local_b8[0x15] = '\0';
      local_b8[0x16] = '\0';
      local_b8[0x17] = '\0';
      local_a0 = "default";
      pcVar6 = local_98.d.ptr;
      if (local_98.d.ptr == (char *)0x0) {
        pcVar6 = (char *)&QByteArray::_empty;
      }
      QMessageLogger::warning
                (local_b8,"Failed to compile shader: %s\nSource was:\n%s",pcVar6,pcVar10);
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
        }
      }
      goto LAB_0056eb20;
    }
    d = this_00->d;
    if ((d != (Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *)0x0) &&
       (0x7f < (long)d->size)) {
      if (1 < (uint)(d->ref).atomic._q_value.super___atomic_base<int>._M_i) {
        d = QHashPrivate::Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_>::detached(d);
        this_00->d = d;
      }
      if (d->spans->offsets[0] == 0xff) {
        uVar8 = 1;
        do {
          uVar7 = uVar8;
          if (d->numBuckets == uVar7) {
            d = (Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *)0x0;
            uVar7 = 0;
            break;
          }
          uVar8 = uVar7 + 1;
        } while (d->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f] == 0xff);
        if (d != (Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *)0x0 || uVar7 != 0)
        goto LAB_0056e9f9;
      }
      else {
        uVar7 = 0;
LAB_0056e9f9:
        do {
          (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
            functions[0x45])((ulong)*(uint *)(d->spans[uVar7 >> 7].entries
                                              [d->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f]].
                                              storage.data + 0x18));
          do {
            if (d->numBuckets - 1 == uVar7) {
              d = (Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *)0x0;
              uVar7 = 0;
              break;
            }
            uVar7 = uVar7 + 1;
          } while (d->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f] == 0xff);
        } while ((d != (Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *)0x0) ||
                (uVar7 != 0));
      }
      QHash<QRhiShaderStage,_unsigned_int>::clear(this_00);
    }
    iVar12 = QHash<QRhiShaderStage,unsigned_int>::emplace<unsigned_int_const&>
                       ((QHash<QRhiShaderStage,unsigned_int> *)this_00,shaderStage,&local_5c);
    uVar8 = iVar12.i.bucket;
  }
  else {
    pSVar1 = (cVar11.i.d)->spans;
    uVar7 = cVar11.i.bucket >> 7;
    uVar8 = (ulong)((uint)cVar11.i.bucket & 0x7f);
    local_5c = *(uint *)(pSVar1[uVar7].entries[pSVar1[uVar7].offsets[uVar8]].storage.data + 0x18);
  }
  (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions[0x30]
  )((ulong)program,(ulong)local_5c,uVar8);
  bVar9 = true;
LAB_0056eb22:
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar9;
}

Assistant:

bool QRhiGles2::compileShader(GLuint program, const QRhiShaderStage &shaderStage, QShaderVersion *shaderVersion)
{
    const QByteArray source = shaderSource(shaderStage, shaderVersion);
    if (source.isEmpty())
        return false;

    GLuint shader;
    auto cacheIt = m_shaderCache.constFind(shaderStage);
    if (cacheIt != m_shaderCache.constEnd()) {
        shader = *cacheIt;
    } else {
        shader = f->glCreateShader(toGlShaderType(shaderStage.type()));
        const char *srcStr = source.constData();
        const GLint srcLength = source.size();
        f->glShaderSource(shader, 1, &srcStr, &srcLength);
        f->glCompileShader(shader);
        GLint compiled = 0;
        f->glGetShaderiv(shader, GL_COMPILE_STATUS, &compiled);
        if (!compiled) {
            GLint infoLogLength = 0;
            f->glGetShaderiv(shader, GL_INFO_LOG_LENGTH, &infoLogLength);
            QByteArray log;
            if (infoLogLength > 1) {
                GLsizei length = 0;
                log.resize(infoLogLength);
                f->glGetShaderInfoLog(shader, infoLogLength, &length, log.data());
            }
            qWarning("Failed to compile shader: %s\nSource was:\n%s", log.constData(), source.constData());
            return false;
        }
        if (m_shaderCache.size() >= MAX_SHADER_CACHE_ENTRIES) {
            // Use the simplest strategy: too many cached shaders -> drop them all.
            for (uint shader : m_shaderCache)
                f->glDeleteShader(shader); // does not actually get released yet when attached to a not-yet-released program
            m_shaderCache.clear();
        }
        m_shaderCache.insert(shaderStage, shader);
    }

    f->glAttachShader(program, shader);

    return true;
}